

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixTruncate(sqlite3_file *id,i64 nByte)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  uVar1 = *(uint *)&id[9].pMethods;
  if (0 < (int)uVar1) {
    lVar4 = nByte + (ulong)uVar1 + -1;
    nByte = lVar4 - lVar4 % (long)(ulong)uVar1;
  }
  iVar2 = robust_ftruncate(*(int *)&id[3].pMethods,nByte);
  if (iVar2 == 0) {
    iVar2 = 0;
    if (nByte < (long)id[10].pMethods) {
      id[10].pMethods = (sqlite3_io_methods *)nByte;
      iVar2 = 0;
    }
  }
  else {
    piVar3 = __errno_location();
    *(int *)&id[4].pMethods = *piVar3;
    unixLogErrorAtLine(0x60a,"ftruncate",(char *)id[7].pMethods,0xa5aa);
    iVar2 = 0x60a;
  }
  return iVar2;
}

Assistant:

static int unixTruncate(sqlite3_file *id, i64 nByte){
  unixFile *pFile = (unixFile *)id;
  int rc;
  assert( pFile );
  SimulateIOError( return SQLITE_IOERR_TRUNCATE );

  /* If the user has configured a chunk-size for this file, truncate the
  ** file so that it consists of an integer number of chunks (i.e. the
  ** actual file size after the operation may be larger than the requested
  ** size).
  */
  if( pFile->szChunk>0 ){
    nByte = ((nByte + pFile->szChunk - 1)/pFile->szChunk) * pFile->szChunk;
  }

  rc = robust_ftruncate(pFile->h, nByte);
  if( rc ){
    storeLastErrno(pFile, errno);
    return unixLogError(SQLITE_IOERR_TRUNCATE, "ftruncate", pFile->zPath);
  }else{
#ifdef SQLITE_DEBUG
    /* If we are doing a normal write to a database file (as opposed to
    ** doing a hot-journal rollback or a write to some file other than a
    ** normal database file) and we truncate the file to zero length,
    ** that effectively updates the change counter.  This might happen
    ** when restoring a database using the backup API from a zero-length
    ** source.
    */
    if( pFile->inNormalWrite && nByte==0 ){
      pFile->transCntrChng = 1;
    }
#endif

#if SQLITE_MAX_MMAP_SIZE>0
    /* If the file was just truncated to a size smaller than the currently
    ** mapped region, reduce the effective mapping size as well. SQLite will
    ** use read() and write() to access data beyond this point from now on.
    */
    if( nByte<pFile->mmapSize ){
      pFile->mmapSize = nByte;
    }
#endif

    return SQLITE_OK;
  }
}